

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsRunScriptWithParserState
          (JsValueRef script,JsSourceContext sourceContext,JsValueRef sourceUrl,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,JsValueRef *result)

{
  bool bVar1;
  WCHAR *url_00;
  WCHAR *url;
  JsValueRef *result_local;
  JsValueRef parserState_local;
  JsParseScriptAttributes parseAttributes_local;
  JsValueRef sourceUrl_local;
  JsSourceContext sourceContext_local;
  JsValueRef script_local;
  
  if ((sourceUrl == (JsValueRef)0x0) || (bVar1 = Js::VarIs<Js::JavascriptString>(sourceUrl), !bVar1)
     ) {
    script_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    url_00 = (WCHAR *)(**(code **)(*sourceUrl + 0x328))();
    script_local._4_4_ =
         RunScriptWithParserStateCore
                   (0,script,sourceContext,url_00,parseAttributes,parserState,false,result);
  }
  return script_local._4_4_;
}

Assistant:

CHAKRA_API JsRunScriptWithParserState(
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _Out_ JsValueRef *result)
{
    WCHAR *url = nullptr;
    if (sourceUrl && Js::VarIs<Js::JavascriptString>(sourceUrl))
    {
        url = const_cast<WCHAR*>(((Js::JavascriptString*)(sourceUrl))->GetSz());
        return RunScriptWithParserStateCore(0, script, sourceContext, url, parseAttributes, parserState, false, result);
    }
    else
    {
        return JsErrorInvalidArgument;
    }
}